

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

CEAngle CESkyCoord::AngularSeparation(CESkyCoord *coords1,CESkyCoord *coords2)

{
  CESkyCoord *pCVar1;
  CESkyCoordType CVar2;
  CESkyCoordType CVar3;
  string *origin;
  CESkyCoord *in_RDX;
  CESkyCoord *in_RSI;
  CEAngle *in_RDI;
  double dVar4;
  CEDate *this;
  double *angle;
  double extraout_XMM0_Qa;
  CEAngle CVar5;
  double y2;
  double y1;
  double *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  CEDateType date_format;
  double in_stack_fffffffffffffd98;
  undefined1 *date;
  CEDate *in_stack_fffffffffffffda0;
  string *message;
  CEAngle *in_stack_fffffffffffffde0;
  allocator *this_00;
  CEAngle *ycoord_first;
  undefined4 in_stack_fffffffffffffdf8;
  undefined1 local_1f0 [64];
  undefined1 local_1b0 [32];
  undefined1 local_190 [64];
  undefined1 local_150 [16];
  CEAngle local_140;
  double local_130;
  undefined1 local_128 [64];
  CEAngle local_e8;
  CEDate *local_d8;
  undefined1 local_d0 [64];
  CEAngle local_90;
  double local_80;
  undefined1 local_72;
  undefined1 local_71 [56];
  allocator local_39;
  string local_38 [32];
  CESkyCoord *local_18;
  CESkyCoord *local_10;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffd90 >> 0x20);
  ycoord_first = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  CVar2 = GetCoordSystem(in_RSI);
  CVar3 = GetCoordSystem(local_18);
  pCVar1 = local_10;
  if (CVar2 != CVar3) {
    local_72 = 1;
    origin = (string *)__cxa_allocate_exception(0xa8);
    this_00 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_38,"CESkyCoord::AngularSeparation(CESkyCoord&, CESkyCoord&)",this_00);
    message = (string *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_71 + 1),"Supplied coordinates are in different frames",
               (allocator *)message);
    CEException::invalid_value::invalid_value((invalid_value *)this_00,origin,message);
    local_72 = 0;
    __cxa_throw(origin,&CEException::invalid_value::typeinfo,
                CEException::invalid_value::~invalid_value);
  }
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,date_format);
  (*pCVar1->_vptr_CESkyCoord[4])(&local_90,pCVar1,local_d0);
  dVar4 = CEAngle::Rad(&local_90);
  CEAngle::~CEAngle((CEAngle *)0x143a44);
  CEDate::~CEDate((CEDate *)0x143a51);
  pCVar1 = local_18;
  local_80 = dVar4;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,date_format);
  (*pCVar1->_vptr_CESkyCoord[4])(&local_e8,pCVar1,local_128);
  this = (CEDate *)CEAngle::Rad(&local_e8);
  CEAngle::~CEAngle((CEAngle *)0x143ac5);
  CEDate::~CEDate((CEDate *)0x143ad2);
  local_d8 = this;
  CVar3 = GetCoordSystem(local_10);
  if (CVar3 == OBSERVED) {
    local_80 = 1.5707963267948966 - local_80;
    local_d8 = (CEDate *)(1.5707963267948966 - (double)local_d8);
  }
  CppEphem::julian_date_J2000();
  date = local_190;
  CEDate::CEDate(this,(double)date,(CEDateType)((ulong)local_10 >> 0x20));
  (*local_10->_vptr_CESkyCoord[3])(local_150,local_10,date);
  CEAngle::CEAngle((CEAngle *)local_10,in_stack_fffffffffffffd88);
  angle = (double *)CppEphem::julian_date_J2000();
  CEDate::CEDate(this,(double)date,(CEDateType)((ulong)local_10 >> 0x20));
  (*local_18->_vptr_CESkyCoord[3])(local_1b0,local_18,local_1f0);
  CEAngle::CEAngle((CEAngle *)local_10,angle);
  AngularSeparation((CEAngle *)CONCAT44(CVar2,in_stack_fffffffffffffdf8),ycoord_first,in_RDI,
                    in_stack_fffffffffffffde0);
  local_130 = CEAngle::operator_cast_to_double(&local_140);
  CEAngle::CEAngle((CEAngle *)local_10,angle);
  CEAngle::~CEAngle((CEAngle *)0x143cf6);
  CEAngle::~CEAngle((CEAngle *)0x143d03);
  CEAngle::~CEAngle((CEAngle *)0x143d10);
  CEDate::~CEDate((CEDate *)0x143d1d);
  CEAngle::~CEAngle((CEAngle *)0x143d2a);
  CEAngle::~CEAngle((CEAngle *)0x143d37);
  CEDate::~CEDate((CEDate *)0x143d44);
  CVar5.angle_ = extraout_XMM0_Qa;
  CVar5._vptr_CEAngle = (_func_int **)ycoord_first;
  return CVar5;
}

Assistant:

CEAngle CESkyCoord::AngularSeparation(const CESkyCoord& coords1, 
                                      const CESkyCoord& coords2)
{
    // Make sure the coordinates are in the same frame
    if (coords1.GetCoordSystem() != coords2.GetCoordSystem()) {
        throw CEException::invalid_value("CESkyCoord::AngularSeparation(CESkyCoord&, CESkyCoord&)",
                                         "Supplied coordinates are in different frames");
    }

    // Get the appropriate Y-Coordinates
    double y1 = coords1.YCoord().Rad();
    double y2 = coords2.YCoord().Rad();
    if (coords1.GetCoordSystem() == CESkyCoordType::OBSERVED) {
        y1 = M_PI_2 - y1;
        y2 = M_PI_2 - y2;
    }

    // Convert the second coordinates to be the same type as the first set of coordinates
    return AngularSeparation(coords1.XCoord(), y1,
                             coords2.XCoord(), y2);
}